

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O3

void func_call_inline(size_t n)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar2 = std::chrono::_V2::system_clock::now();
  side_effect = side_effect + ((uint)n & 1);
  dVar5 = (double)(lVar2 - lVar1) / 1000000000.0;
  dVar6 = dVar5 * 1000.0 * 1000.0 * 1000.0 * 3.725290298461914e-09;
  expand_name("func_call_inline");
  sVar3 = strlen(expand_name::buf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,expand_name::buf,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar4 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ns per operation,\t",0x12);
  poVar4 = std::ostream::_M_insert<double>(dVar6 / unit);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ticks,\t",8);
  poVar4 = std::ostream::_M_insert<double>(((268435456.0 / dVar5) / 1000.0) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Mrps",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

static void __attribute__((noinline))
func_call_inline(size_t n)
{
    size_t res = 0;
    now_t start = now();
    const size_t COUNT = 0x10000000;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        size_t x = f_inline(res, n);
        res += x;
    }
    now_t stop = now();
    side_effect += res % 2;


    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}